

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conelinei_intersector.h
# Opt level: O3

bool embree::avx::ConeCurveMiMBIntersector1<8,_true>::occluded
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *line)

{
  undefined8 *puVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  Geometry *pGVar12;
  long lVar13;
  long lVar14;
  RTCFilterFunctionN p_Var15;
  ulong uVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  float fVar50;
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  byte bVar78;
  long lVar79;
  Scene *pSVar80;
  undefined4 uVar81;
  long lVar82;
  ulong uVar83;
  bool bVar84;
  float fVar85;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar89 [32];
  float fVar92;
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  float fVar98;
  undefined1 auVar99 [16];
  float fVar104;
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  float fVar105;
  undefined1 auVar103 [32];
  float fVar106;
  float fVar107;
  float fVar112;
  float fVar114;
  float fVar116;
  float fVar118;
  float fVar120;
  float fVar122;
  undefined1 auVar108 [32];
  float fVar113;
  float fVar115;
  float fVar117;
  float fVar119;
  float fVar121;
  float fVar123;
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [64];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [64];
  float fVar129;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [64];
  float fVar147;
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  float fVar152;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [64];
  float fVar165;
  float fVar166;
  float fVar172;
  float fVar175;
  float fVar177;
  float fVar179;
  float fVar181;
  float fVar183;
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  float fVar173;
  float fVar176;
  float fVar178;
  float fVar180;
  float fVar182;
  float fVar184;
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  float fVar174;
  undefined1 auVar171 [32];
  float fVar185;
  float fVar186;
  float fVar189;
  float fVar191;
  float fVar193;
  float fVar195;
  float fVar197;
  float fVar199;
  undefined1 auVar187 [32];
  float fVar190;
  float fVar192;
  float fVar194;
  float fVar196;
  float fVar198;
  float fVar200;
  float fVar201;
  undefined1 auVar188 [64];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  float fVar208;
  undefined1 auVar209 [28];
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar219;
  float fVar220;
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [64];
  undefined1 auVar221 [28];
  undefined1 auVar222 [64];
  float fVar223;
  float fVar229;
  float fVar230;
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [64];
  float fVar231;
  float fVar236;
  float fVar237;
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar241;
  undefined1 auVar232 [32];
  float fVar242;
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [64];
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  Scene *scene;
  RoundLineIntersectorHitM<8> hit;
  int local_60c;
  RayQueryContext *local_608;
  undefined4 local_600;
  undefined4 local_5fc;
  undefined4 local_5f8;
  undefined4 local_5f4;
  undefined4 local_5f0;
  uint local_5ec;
  uint local_5e8;
  uint local_5e4;
  uint local_5e0;
  RTCFilterFunctionNArguments local_5d0;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  undefined8 uStack_590;
  undefined8 uStack_588;
  Primitive *local_578;
  Scene *local_570;
  Ray *local_568;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [32];
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [32];
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  undefined4 uStack_2e4;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [16];
  undefined1 local_250 [16];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_170 [16];
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float local_e0;
  float fStack_dc;
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  undefined1 local_c0 [32];
  float local_a0;
  float fStack_9c;
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  float local_80;
  float fStack_7c;
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  undefined1 auVar88 [32];
  float fVar164;
  
  local_568 = ray;
  local_608 = context;
  pSVar80 = context->scene;
  uVar3 = line->sharedGeomID;
  local_570 = pSVar80;
  pGVar12 = (pSVar80->geometries).items[uVar3].ptr;
  fVar164 = (pGVar12->time_range).lower;
  fVar164 = pGVar12->fnumTimeSegments *
            (((ray->dir).field_0.m128[3] - fVar164) / ((pGVar12->time_range).upper - fVar164));
  auVar99 = vroundss_avx(ZEXT416((uint)fVar164),ZEXT416((uint)fVar164),9);
  auVar99 = vminss_avx(auVar99,ZEXT416((uint)(pGVar12->fnumTimeSegments + -1.0)));
  auVar99 = vmaxss_avx(ZEXT816(0),auVar99);
  uVar4 = (line->v0).field_0.i[0];
  lVar13 = *(long *)&pGVar12[3].time_range.upper;
  lVar79 = (long)(int)auVar99._0_4_ * 0x38;
  lVar14 = *(long *)(lVar13 + lVar79);
  lVar82 = *(long *)(lVar13 + 0x10 + lVar79);
  uVar5 = (line->v0).field_0.i[1];
  uVar6 = (line->v0).field_0.i[2];
  uVar7 = (line->v0).field_0.i[4];
  puVar1 = (undefined8 *)(lVar14 + lVar82 * (ulong)uVar7);
  uStack_550 = *puVar1;
  _local_560 = *(undefined1 (*) [16])(lVar14 + lVar82 * (ulong)uVar4);
  uStack_548 = puVar1[1];
  uVar8 = (line->v0).field_0.i[5];
  puVar1 = (undefined8 *)(lVar14 + lVar82 * (ulong)uVar8);
  uStack_590 = *puVar1;
  _local_5a0 = *(undefined1 (*) [16])(lVar14 + lVar82 * (ulong)uVar5);
  uStack_588 = puVar1[1];
  uVar9 = (line->v0).field_0.i[6];
  auVar124._16_16_ = *(undefined1 (*) [16])(lVar14 + lVar82 * (ulong)uVar9);
  auVar124._0_16_ = *(undefined1 (*) [16])(lVar14 + lVar82 * (ulong)uVar6);
  uVar10 = (line->v0).field_0.i[3];
  uVar11 = (line->v0).field_0.i[7];
  auVar108._16_16_ = *(undefined1 (*) [16])(lVar14 + lVar82 * (ulong)uVar11);
  auVar108._0_16_ = *(undefined1 (*) [16])(lVar14 + lVar82 * (ulong)uVar10);
  auVar93._16_16_ = *(undefined1 (*) [16])(lVar14 + lVar82 * (ulong)(uVar7 + 1));
  auVar93._0_16_ = *(undefined1 (*) [16])(lVar14 + lVar82 * (ulong)(uVar4 + 1));
  puVar1 = (undefined8 *)(lVar14 + lVar82 * (ulong)(uVar8 + 1));
  local_4a0._16_8_ = *puVar1;
  local_4a0._0_16_ = *(undefined1 (*) [16])(lVar14 + lVar82 * (ulong)(uVar5 + 1));
  local_4a0._24_8_ = puVar1[1];
  auVar148._16_16_ = *(undefined1 (*) [16])(lVar14 + lVar82 * (ulong)(uVar9 + 1));
  auVar148._0_16_ = *(undefined1 (*) [16])(lVar14 + lVar82 * (ulong)(uVar6 + 1));
  auVar187._16_16_ = *(undefined1 (*) [16])(lVar14 + lVar82 * (ulong)(uVar11 + 1));
  auVar187._0_16_ = *(undefined1 (*) [16])(lVar14 + lVar82 * (ulong)(uVar10 + 1));
  lVar14 = *(long *)(lVar13 + 0x38 + lVar79);
  lVar13 = *(long *)(lVar13 + 0x48 + lVar79);
  lVar82 = (ulong)uVar5 * lVar13;
  auVar202._16_16_ = *(undefined1 (*) [16])(lVar14 + (ulong)uVar7 * lVar13);
  auVar202._0_16_ = *(undefined1 (*) [16])(lVar14 + (ulong)uVar4 * lVar13);
  auVar204._16_16_ = *(undefined1 (*) [16])(lVar14 + (ulong)uVar8 * lVar13);
  auVar204._0_16_ = *(undefined1 (*) [16])(lVar14 + lVar82);
  auVar210._16_16_ = *(undefined1 (*) [16])(lVar14 + (ulong)uVar9 * lVar13);
  auVar210._0_16_ = *(undefined1 (*) [16])(lVar14 + (ulong)uVar6 * lVar13);
  auVar224._16_16_ = *(undefined1 (*) [16])(lVar14 + (ulong)uVar11 * lVar13);
  auVar224._0_16_ = *(undefined1 (*) [16])(lVar14 + (ulong)uVar10 * lVar13);
  auVar130._16_16_ = *(undefined1 (*) [16])(lVar14 + (ulong)(uVar7 + 1) * lVar13);
  auVar130._0_16_ = *(undefined1 (*) [16])(lVar14 + (ulong)(uVar4 + 1) * lVar13);
  auVar100._16_16_ = *(undefined1 (*) [16])(lVar14 + (ulong)(uVar9 + 1) * lVar13);
  auVar100._0_16_ = *(undefined1 (*) [16])(lVar14 + (ulong)(uVar6 + 1) * lVar13);
  fVar164 = fVar164 - auVar99._0_4_;
  auVar127 = vunpcklps_avx(_local_560,auVar124);
  auVar155 = vunpckhps_avx(_local_560,auVar124);
  auVar139 = vunpcklps_avx(_local_5a0,auVar108);
  auVar110 = vunpckhps_avx(_local_5a0,auVar108);
  auVar43 = vunpcklps_avx(auVar127,auVar139);
  auVar127 = vunpckhps_avx(auVar127,auVar139);
  auVar44 = vunpcklps_avx(auVar155,auVar110);
  auVar155 = vunpckhps_avx(auVar155,auVar110);
  auVar227 = vunpcklps_avx(auVar93,auVar148);
  auVar110 = vunpckhps_avx(auVar93,auVar148);
  auVar234 = vunpcklps_avx(local_4a0,auVar187);
  auVar139 = vunpckhps_avx(local_4a0,auVar187);
  auVar45 = vunpcklps_avx(auVar227,auVar234);
  auVar227 = vunpckhps_avx(auVar227,auVar234);
  auVar46 = vunpcklps_avx(auVar110,auVar139);
  auVar110 = vunpckhps_avx(auVar110,auVar139);
  auVar47 = vunpcklps_avx(auVar202,auVar210);
  auVar139 = vunpckhps_avx(auVar202,auVar210);
  auVar48 = vunpcklps_avx(auVar204,auVar224);
  auVar234 = vunpckhps_avx(auVar204,auVar224);
  auVar88 = vunpcklps_avx(auVar47,auVar48);
  auVar47 = vunpckhps_avx(auVar47,auVar48);
  auVar89 = vunpcklps_avx(auVar139,auVar234);
  auVar139 = vunpckhps_avx(auVar139,auVar234);
  auVar49 = vunpcklps_avx(auVar130,auVar100);
  auVar234 = vunpckhps_avx(auVar130,auVar100);
  auVar131._16_16_ = *(undefined1 (*) [16])(lVar14 + (ulong)(uVar8 + 1) * lVar13);
  auVar131._0_16_ = *(undefined1 (*) [16])(lVar14 + (ulong)(uVar5 + 1) * lVar13);
  auVar211._16_16_ = *(undefined1 (*) [16])(lVar14 + lVar13 * (ulong)(uVar11 + 1));
  auVar211._0_16_ = *(undefined1 (*) [16])(lVar14 + (ulong)(uVar10 + 1) * lVar13);
  auVar93 = vunpcklps_avx(auVar131,auVar211);
  auVar48 = vunpckhps_avx(auVar131,auVar211);
  auVar94 = vunpcklps_avx(auVar49,auVar93);
  auVar49 = vunpckhps_avx(auVar49,auVar93);
  auVar93 = vunpcklps_avx(auVar234,auVar48);
  auVar234 = vunpckhps_avx(auVar234,auVar48);
  auVar99 = vshufps_avx(ZEXT416((uint)fVar164),ZEXT416((uint)fVar164),0);
  auVar87 = vshufps_avx(ZEXT416((uint)(1.0 - fVar164)),ZEXT416((uint)(1.0 - fVar164)),0);
  fVar164 = auVar99._0_4_;
  fVar174 = auVar99._4_4_;
  fVar106 = auVar99._8_4_;
  fVar114 = auVar99._12_4_;
  fVar118 = auVar88._28_4_;
  fVar85 = auVar87._0_4_;
  fVar92 = auVar87._4_4_;
  fVar112 = auVar87._8_4_;
  fVar116 = auVar87._12_4_;
  local_4e0._0_4_ = auVar43._0_4_ * fVar85 + auVar88._0_4_ * fVar164;
  local_4e0._4_4_ = auVar43._4_4_ * fVar92 + auVar88._4_4_ * fVar174;
  fStack_4d8 = auVar43._8_4_ * fVar112 + auVar88._8_4_ * fVar106;
  fStack_4d4 = auVar43._12_4_ * fVar116 + auVar88._12_4_ * fVar114;
  fStack_4d0 = auVar43._16_4_ * fVar85 + auVar88._16_4_ * fVar164;
  fStack_4cc = auVar43._20_4_ * fVar92 + auVar88._20_4_ * fVar174;
  fStack_4c8 = auVar43._24_4_ * fVar112 + auVar88._24_4_ * fVar106;
  fStack_4c4 = auVar43._28_4_ + fVar118;
  auVar167._0_4_ = auVar127._0_4_ * fVar85 + fVar164 * auVar47._0_4_;
  auVar167._4_4_ = auVar127._4_4_ * fVar92 + fVar174 * auVar47._4_4_;
  auVar167._8_4_ = auVar127._8_4_ * fVar112 + fVar106 * auVar47._8_4_;
  auVar167._12_4_ = auVar127._12_4_ * fVar116 + fVar114 * auVar47._12_4_;
  auVar167._16_4_ = auVar127._16_4_ * fVar85 + fVar164 * auVar47._16_4_;
  auVar167._20_4_ = auVar127._20_4_ * fVar92 + fVar174 * auVar47._20_4_;
  auVar167._24_4_ = auVar127._24_4_ * fVar112 + fVar106 * auVar47._24_4_;
  auVar167._28_4_ = fVar118 + auVar47._28_4_;
  local_5a0._0_4_ = auVar44._0_4_;
  local_5a0._4_4_ = auVar44._4_4_;
  fStack_598 = auVar44._8_4_;
  fStack_594 = auVar44._12_4_;
  uStack_590._0_4_ = auVar44._16_4_;
  uStack_590._4_4_ = auVar44._20_4_;
  uStack_588._0_4_ = auVar44._24_4_;
  auVar149._0_4_ = fVar85 * (float)local_5a0._0_4_ + auVar89._0_4_ * fVar164;
  auVar149._4_4_ = fVar92 * (float)local_5a0._4_4_ + auVar89._4_4_ * fVar174;
  auVar149._8_4_ = fVar112 * fStack_598 + auVar89._8_4_ * fVar106;
  auVar149._12_4_ = fVar116 * fStack_594 + auVar89._12_4_ * fVar114;
  auVar149._16_4_ = fVar85 * (float)uStack_590 + auVar89._16_4_ * fVar164;
  auVar149._20_4_ = fVar92 * uStack_590._4_4_ + auVar89._20_4_ * fVar174;
  auVar149._24_4_ = fVar112 * (float)uStack_588 + auVar89._24_4_ * fVar106;
  auVar149._28_4_ = fVar118 + auVar89._28_4_;
  auVar203._8_4_ = 0x3f800000;
  auVar203._0_8_ = 0x3f8000003f800000;
  auVar203._12_4_ = 0x3f800000;
  auVar203._16_4_ = 0x3f800000;
  auVar203._20_4_ = 0x3f800000;
  auVar203._24_4_ = 0x3f800000;
  auVar203._28_4_ = 0x3f800000;
  local_5a0._0_4_ = fVar85 * auVar155._0_4_ + fVar164 * auVar139._0_4_;
  local_5a0._4_4_ = fVar92 * auVar155._4_4_ + fVar174 * auVar139._4_4_;
  fStack_598 = fVar112 * auVar155._8_4_ + fVar106 * auVar139._8_4_;
  fStack_594 = fVar116 * auVar155._12_4_ + fVar114 * auVar139._12_4_;
  uStack_590._0_4_ = fVar85 * auVar155._16_4_ + fVar164 * auVar139._16_4_;
  uStack_590._4_4_ = fVar92 * auVar155._20_4_ + fVar174 * auVar139._20_4_;
  uStack_588._0_4_ = fVar112 * auVar155._24_4_ + fVar106 * auVar139._24_4_;
  uStack_588._4_4_ = auVar155._28_4_ + auVar139._28_4_;
  local_520._0_4_ = fVar85 * auVar45._0_4_ + auVar94._0_4_ * fVar164;
  local_520._4_4_ = fVar92 * auVar45._4_4_ + auVar94._4_4_ * fVar174;
  fStack_518 = fVar112 * auVar45._8_4_ + auVar94._8_4_ * fVar106;
  fStack_514 = fVar116 * auVar45._12_4_ + auVar94._12_4_ * fVar114;
  fStack_510 = fVar85 * auVar45._16_4_ + auVar94._16_4_ * fVar164;
  fStack_50c = fVar92 * auVar45._20_4_ + auVar94._20_4_ * fVar174;
  fStack_508 = fVar112 * auVar45._24_4_ + auVar94._24_4_ * fVar106;
  fStack_504 = auVar45._28_4_ + uStack_588._4_4_;
  auVar232._0_4_ = auVar227._0_4_ * fVar85 + auVar49._0_4_ * fVar164;
  auVar232._4_4_ = auVar227._4_4_ * fVar92 + auVar49._4_4_ * fVar174;
  auVar232._8_4_ = auVar227._8_4_ * fVar112 + auVar49._8_4_ * fVar106;
  auVar232._12_4_ = auVar227._12_4_ * fVar116 + auVar49._12_4_ * fVar114;
  auVar232._16_4_ = auVar227._16_4_ * fVar85 + auVar49._16_4_ * fVar164;
  auVar232._20_4_ = auVar227._20_4_ * fVar92 + auVar49._20_4_ * fVar174;
  auVar232._24_4_ = auVar227._24_4_ * fVar112 + auVar49._24_4_ * fVar106;
  auVar232._28_4_ = uStack_588._4_4_ + auVar155._28_4_;
  local_560._0_4_ = auVar46._0_4_;
  local_560._4_4_ = auVar46._4_4_;
  fStack_558 = auVar46._8_4_;
  fStack_554 = auVar46._12_4_;
  uStack_550._0_4_ = auVar46._16_4_;
  uStack_550._4_4_ = auVar46._20_4_;
  uStack_548._0_4_ = auVar46._24_4_;
  auVar205._0_4_ = fVar85 * (float)local_560._0_4_ + fVar164 * auVar93._0_4_;
  auVar205._4_4_ = fVar92 * (float)local_560._4_4_ + fVar174 * auVar93._4_4_;
  auVar205._8_4_ = fVar112 * fStack_558 + fVar106 * auVar93._8_4_;
  auVar205._12_4_ = fVar116 * fStack_554 + fVar114 * auVar93._12_4_;
  auVar205._16_4_ = fVar85 * (float)uStack_550 + fVar164 * auVar93._16_4_;
  auVar205._20_4_ = fVar92 * uStack_550._4_4_ + fVar174 * auVar93._20_4_;
  auVar205._24_4_ = fVar112 * (float)uStack_548 + fVar106 * auVar93._24_4_;
  auVar205._28_4_ = uStack_588._4_4_ + auVar93._28_4_;
  local_540._0_4_ = auVar110._0_4_;
  local_540._4_4_ = auVar110._4_4_;
  fStack_538 = auVar110._8_4_;
  fStack_534 = auVar110._12_4_;
  fStack_530 = auVar110._16_4_;
  fStack_52c = auVar110._20_4_;
  fStack_528 = auVar110._24_4_;
  auVar86._0_4_ = fVar85 * (float)local_540._0_4_ + fVar164 * auVar234._0_4_;
  auVar86._4_4_ = fVar92 * (float)local_540._4_4_ + fVar174 * auVar234._4_4_;
  auVar86._8_4_ = fVar112 * fStack_538 + fVar106 * auVar234._8_4_;
  auVar86._12_4_ = fVar116 * fStack_534 + fVar114 * auVar234._12_4_;
  auVar88._16_4_ = fVar85 * fStack_530 + fVar164 * auVar234._16_4_;
  auVar88._0_16_ = auVar86;
  auVar88._20_4_ = fVar92 * fStack_52c + fVar174 * auVar234._20_4_;
  auVar88._24_4_ = fVar112 * fStack_528 + fVar106 * auVar234._24_4_;
  auVar88._28_4_ = auVar93._28_4_ + auVar234._28_4_;
  auVar99 = vpcmpeqd_avx(auVar86,auVar86);
  auVar87 = vpcmpeqd_avx(auVar99,*(undefined1 (*) [16])(line->primIDs).field_0.field_1.vl);
  local_578 = line;
  auVar99 = vpcmpeqd_avx(auVar99,*(undefined1 (*) [16])((long)&(line->primIDs).field_0 + 0x10));
  auVar89._16_16_ = auVar99;
  auVar89._0_16_ = auVar87;
  local_250 = vshufps_avx(ZEXT416(uVar3),ZEXT416(uVar3),0);
  local_260 = local_250;
  uVar83 = *(ulong *)((long)&(ray->dir).field_0 + 4);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = uVar83;
  aVar2 = (ray->dir).field_0;
  auVar99 = vshufps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0xee);
  fVar85 = (float)uVar83;
  fVar164 = (ray->dir).field_0.m128[0];
  auVar99 = ZEXT416((uint)(fVar164 * fVar164 + fVar85 * fVar85 + auVar99._0_4_ * auVar99._0_4_));
  auVar99 = vshufps_avx(auVar99,auVar99,0);
  auVar101._16_16_ = auVar99;
  auVar101._0_16_ = auVar99;
  auVar155 = vrcpps_avx(auVar101);
  fVar106 = auVar155._0_4_;
  fVar112 = auVar155._4_4_;
  auVar110._4_4_ = fVar112 * auVar99._4_4_;
  auVar110._0_4_ = fVar106 * auVar99._0_4_;
  fVar114 = auVar155._8_4_;
  auVar110._8_4_ = fVar114 * auVar99._8_4_;
  fVar116 = auVar155._12_4_;
  auVar110._12_4_ = fVar116 * auVar99._12_4_;
  fVar118 = auVar155._16_4_;
  auVar110._16_4_ = fVar118 * auVar99._0_4_;
  fVar120 = auVar155._20_4_;
  auVar110._20_4_ = fVar120 * auVar99._4_4_;
  fVar122 = auVar155._24_4_;
  auVar110._24_4_ = fVar122 * auVar99._8_4_;
  auVar110._28_4_ = auVar99._12_4_;
  auVar110 = vsubps_avx(auVar203,auVar110);
  fStack_344 = auVar155._28_4_ + auVar110._28_4_;
  auVar139._4_4_ = ((float)local_520._4_4_ + (float)local_4e0._4_4_) * 0.5;
  auVar139._0_4_ = ((float)local_520._0_4_ + (float)local_4e0._0_4_) * 0.5;
  auVar139._8_4_ = (fStack_518 + fStack_4d8) * 0.5;
  auVar139._12_4_ = (fStack_514 + fStack_4d4) * 0.5;
  auVar139._16_4_ = (fStack_510 + fStack_4d0) * 0.5;
  auVar139._20_4_ = (fStack_50c + fStack_4cc) * 0.5;
  auVar139._24_4_ = (fStack_508 + fStack_4c8) * 0.5;
  auVar139._28_4_ = fStack_504 + fStack_4c4;
  auVar155._4_4_ = (auVar167._4_4_ + auVar232._4_4_) * 0.5;
  auVar155._0_4_ = (auVar167._0_4_ + auVar232._0_4_) * 0.5;
  auVar155._8_4_ = (auVar167._8_4_ + auVar232._8_4_) * 0.5;
  auVar155._12_4_ = (auVar167._12_4_ + auVar232._12_4_) * 0.5;
  auVar155._16_4_ = (auVar167._16_4_ + auVar232._16_4_) * 0.5;
  auVar155._20_4_ = (auVar167._20_4_ + auVar232._20_4_) * 0.5;
  auVar155._24_4_ = (auVar167._24_4_ + auVar232._24_4_) * 0.5;
  auVar155._28_4_ = auVar167._28_4_ + auVar232._28_4_;
  auVar127._4_4_ = (auVar205._4_4_ + auVar149._4_4_) * 0.5;
  auVar127._0_4_ = (auVar205._0_4_ + auVar149._0_4_) * 0.5;
  auVar127._8_4_ = (auVar205._8_4_ + auVar149._8_4_) * 0.5;
  auVar127._12_4_ = (auVar205._12_4_ + auVar149._12_4_) * 0.5;
  auVar127._16_4_ = (auVar205._16_4_ + auVar149._16_4_) * 0.5;
  auVar127._20_4_ = (auVar205._20_4_ + auVar149._20_4_) * 0.5;
  auVar127._24_4_ = (auVar205._24_4_ + auVar149._24_4_) * 0.5;
  auVar127._28_4_ = 0x3f000000;
  auVar99 = vshufps_avx(auVar87,auVar87,0);
  register0x00001510 = auVar99;
  _local_160 = auVar99;
  auVar87 = vshufps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0xaa);
  fVar164 = (ray->org).field_0.m128[1];
  auVar125._4_4_ = fVar164;
  auVar125._0_4_ = fVar164;
  auVar125._8_4_ = fVar164;
  auVar125._12_4_ = fVar164;
  auVar125._16_4_ = fVar164;
  auVar125._20_4_ = fVar164;
  auVar125._24_4_ = fVar164;
  auVar125._28_4_ = fVar164;
  local_440._16_16_ = auVar87;
  local_440._0_16_ = auVar87;
  auVar155 = vsubps_avx(auVar155,auVar125);
  fVar85 = (ray->org).field_0.m128[2];
  auVar132._4_4_ = fVar85;
  auVar132._0_4_ = fVar85;
  auVar132._8_4_ = fVar85;
  auVar132._12_4_ = fVar85;
  auVar132._16_4_ = fVar85;
  auVar132._20_4_ = fVar85;
  auVar132._24_4_ = fVar85;
  auVar132._28_4_ = fVar85;
  auVar127 = vsubps_avx(auVar127,auVar132);
  fVar223 = auVar87._0_4_;
  fVar229 = auVar87._4_4_;
  fVar230 = auVar87._8_4_;
  fStack_324 = auVar87._12_4_;
  fVar208 = auVar99._0_4_;
  fVar213 = auVar99._4_4_;
  fVar214 = auVar99._8_4_;
  fVar216 = auVar99._12_4_;
  fVar174 = (ray->org).field_0.m128[0];
  auVar94._4_4_ = fVar174;
  auVar94._0_4_ = fVar174;
  auVar94._8_4_ = fVar174;
  auVar94._12_4_ = fVar174;
  auVar94._16_4_ = fVar174;
  auVar94._20_4_ = fVar174;
  auVar94._24_4_ = fVar174;
  auVar94._28_4_ = fVar174;
  fStack_3b8 = (ray->dir).field_0.m128[0];
  auVar139 = vsubps_avx(auVar139,auVar94);
  fVar92 = auVar139._28_4_ + auVar155._28_4_ + auVar127._28_4_;
  fVar98 = (fStack_3b8 * auVar139._0_4_ + fVar208 * auVar155._0_4_ + fVar223 * auVar127._0_4_) *
           (fVar106 + fVar106 * auVar110._0_4_);
  fVar104 = (fStack_3b8 * auVar139._4_4_ + fVar213 * auVar155._4_4_ + fVar229 * auVar127._4_4_) *
            (fVar112 + fVar112 * auVar110._4_4_);
  fStack_358 = (fStack_3b8 * auVar139._8_4_ + fVar214 * auVar155._8_4_ + fVar230 * auVar127._8_4_) *
               (fVar114 + fVar114 * auVar110._8_4_);
  fStack_354 = (fStack_3b8 * auVar139._12_4_ +
               fVar216 * auVar155._12_4_ + fStack_324 * auVar127._12_4_) *
               (fVar116 + fVar116 * auVar110._12_4_);
  fStack_350 = (fStack_3b8 * auVar139._16_4_ + fVar208 * auVar155._16_4_ + fVar223 * auVar127._16_4_
               ) * (fVar118 + fVar118 * auVar110._16_4_);
  fStack_34c = (fStack_3b8 * auVar139._20_4_ + fVar213 * auVar155._20_4_ + fVar229 * auVar127._20_4_
               ) * (fVar120 + fVar120 * auVar110._20_4_);
  fStack_348 = (fStack_3b8 * auVar139._24_4_ + fVar214 * auVar155._24_4_ + fVar230 * auVar127._24_4_
               ) * (fVar122 + fVar122 * auVar110._24_4_);
  auVar168._0_4_ = fVar174 + fStack_3b8 * fVar98;
  auVar168._4_4_ = fVar174 + fStack_3b8 * fVar104;
  auVar168._8_4_ = fVar174 + fStack_3b8 * fStack_358;
  auVar168._12_4_ = fVar174 + fStack_3b8 * fStack_354;
  auVar168._16_4_ = fVar174 + fStack_3b8 * fStack_350;
  auVar168._20_4_ = fVar174 + fStack_3b8 * fStack_34c;
  auVar168._24_4_ = fVar174 + fStack_3b8 * fStack_348;
  auVar168._28_4_ = fVar174 + fVar92;
  auVar95._0_4_ = fVar164 + fVar208 * fVar98;
  auVar95._4_4_ = fVar164 + fVar213 * fVar104;
  auVar95._8_4_ = fVar164 + fVar214 * fStack_358;
  auVar95._12_4_ = fVar164 + fVar216 * fStack_354;
  auVar95._16_4_ = fVar164 + fVar208 * fStack_350;
  auVar95._20_4_ = fVar164 + fVar213 * fStack_34c;
  auVar95._24_4_ = fVar164 + fVar214 * fStack_348;
  auVar95._28_4_ = fVar164 + fVar92;
  _local_360 = CONCAT44(fVar104,fVar98);
  auVar102._0_4_ = fVar85 + fVar223 * fVar98;
  auVar102._4_4_ = fVar85 + fVar229 * fVar104;
  auVar102._8_4_ = fVar85 + fVar230 * fStack_358;
  auVar102._12_4_ = fVar85 + fStack_324 * fStack_354;
  auVar102._16_4_ = fVar85 + fVar223 * fStack_350;
  auVar102._20_4_ = fVar85 + fVar229 * fStack_34c;
  auVar102._24_4_ = fVar85 + fVar230 * fStack_348;
  auVar102._28_4_ = fVar85 + fVar92;
  local_460 = vsubps_avx(auVar232,auVar167);
  local_480 = vsubps_avx(auVar205,auVar149);
  fVar164 = local_480._0_4_;
  fVar114 = local_480._4_4_;
  fVar217 = local_480._8_4_;
  fVar19 = local_480._12_4_;
  fVar25 = local_480._16_4_;
  fVar31 = local_480._20_4_;
  fVar37 = local_480._24_4_;
  fVar85 = local_460._0_4_;
  fVar116 = local_460._4_4_;
  fVar218 = local_460._8_4_;
  fVar20 = local_460._12_4_;
  fVar26 = local_460._16_4_;
  fVar32 = local_460._20_4_;
  fVar38 = local_460._24_4_;
  local_4c0 = vsubps_avx(_local_520,_local_4e0);
  fVar174 = local_4c0._0_4_;
  fVar118 = local_4c0._4_4_;
  fVar219 = local_4c0._8_4_;
  fVar21 = local_4c0._12_4_;
  fVar27 = local_4c0._16_4_;
  fVar33 = local_4c0._20_4_;
  fVar39 = local_4c0._24_4_;
  fVar185 = fVar85 * fVar85 + fVar164 * fVar164 + fVar174 * fVar174;
  fVar189 = fVar116 * fVar116 + fVar114 * fVar114 + fVar118 * fVar118;
  fVar191 = fVar218 * fVar218 + fVar217 * fVar217 + fVar219 * fVar219;
  fVar193 = fVar20 * fVar20 + fVar19 * fVar19 + fVar21 * fVar21;
  fVar195 = fVar26 * fVar26 + fVar25 * fVar25 + fVar27 * fVar27;
  fVar197 = fVar32 * fVar32 + fVar31 * fVar31 + fVar33 * fVar33;
  fVar199 = fVar38 * fVar38 + fVar37 * fVar37 + fVar39 * fVar39;
  fVar201 = auVar139._28_4_ + fVar92 + fStack_504;
  _local_560 = vsubps_avx(auVar95,auVar167);
  local_4a0 = vsubps_avx(auVar102,auVar149);
  fVar92 = local_4a0._0_4_;
  fVar120 = local_4a0._4_4_;
  fVar220 = local_4a0._8_4_;
  fVar22 = local_4a0._12_4_;
  fVar28 = local_4a0._16_4_;
  fVar34 = local_4a0._20_4_;
  fVar40 = local_4a0._24_4_;
  fVar106 = local_560._0_4_;
  fVar122 = local_560._4_4_;
  fVar17 = local_560._8_4_;
  fVar23 = local_560._12_4_;
  fVar29 = local_560._16_4_;
  fVar35 = local_560._20_4_;
  fVar41 = local_560._24_4_;
  local_500 = vsubps_avx(auVar168,_local_4e0);
  fVar165 = local_500._0_4_;
  fVar172 = local_500._4_4_;
  fVar175 = local_500._8_4_;
  fVar177 = local_500._12_4_;
  fVar179 = local_500._16_4_;
  fVar181 = local_500._20_4_;
  fVar183 = local_500._24_4_;
  fVar231 = fVar165 * fVar174 + fVar85 * fVar106 + fVar164 * fVar92;
  fVar236 = fVar172 * fVar118 + fVar116 * fVar122 + fVar114 * fVar120;
  fVar237 = fVar175 * fVar219 + fVar218 * fVar17 + fVar217 * fVar220;
  fVar238 = fVar177 * fVar21 + fVar20 * fVar23 + fVar19 * fVar22;
  fVar239 = fVar179 * fVar27 + fVar26 * fVar29 + fVar25 * fVar28;
  fVar240 = fVar181 * fVar33 + fVar32 * fVar35 + fVar31 * fVar34;
  fVar241 = fVar183 * fVar39 + fVar38 * fVar41 + fVar37 * fVar40;
  fVar242 = auVar167._28_4_ + auVar167._28_4_ + auVar102._28_4_;
  fVar105 = auVar167._28_4_ + auVar167._28_4_ + auVar102._28_4_;
  auVar206._0_4_ = fStack_3b8 * fVar174 + fVar85 * fVar208 + fVar223 * fVar164;
  auVar206._4_4_ = fStack_3b8 * fVar118 + fVar116 * fVar213 + fVar229 * fVar114;
  auVar206._8_4_ = fStack_3b8 * fVar219 + fVar218 * fVar214 + fVar230 * fVar217;
  auVar206._12_4_ = fStack_3b8 * fVar21 + fVar20 * fVar216 + fStack_324 * fVar19;
  auVar206._16_4_ = fStack_3b8 * fVar27 + fVar26 * fVar208 + fVar223 * fVar25;
  auVar206._20_4_ = fStack_3b8 * fVar33 + fVar32 * fVar213 + fVar229 * fVar31;
  auVar206._24_4_ = fStack_3b8 * fVar39 + fVar38 * fVar214 + fVar230 * fVar37;
  auVar206._28_4_ = auVar167._28_4_ + fVar105;
  _local_3c0 = CONCAT44(fStack_3b8,fStack_3b8);
  fStack_3b4 = fStack_3b8;
  fStack_3b0 = fStack_3b8;
  fStack_3ac = fStack_3b8;
  fStack_3a8 = fStack_3b8;
  fStack_3a4 = fStack_3b8;
  fVar50 = local_4a0._28_4_;
  auVar155 = vsubps_avx(_local_5a0,auVar88);
  fVar112 = auVar155._0_4_;
  fVar215 = auVar155._4_4_;
  fVar18 = auVar155._8_4_;
  fVar24 = auVar155._12_4_;
  fVar30 = auVar155._16_4_;
  fVar36 = auVar155._20_4_;
  fVar42 = auVar155._24_4_;
  fVar107 = fVar185 + fVar112 * fVar112;
  fVar113 = fVar189 + fVar215 * fVar215;
  fVar115 = fVar191 + fVar18 * fVar18;
  fVar117 = fVar193 + fVar24 * fVar24;
  fVar119 = fVar195 + fVar30 * fVar30;
  fVar121 = fVar197 + fVar36 * fVar36;
  fVar123 = fVar199 + fVar42 * fVar42;
  fVar129 = fVar185 * fVar185;
  fVar141 = fVar189 * fVar189;
  local_280._4_4_ = fVar141;
  local_280._0_4_ = fVar129;
  fVar142 = fVar191 * fVar191;
  local_280._8_4_ = fVar142;
  fVar143 = fVar193 * fVar193;
  local_280._12_4_ = fVar143;
  fVar144 = fVar195 * fVar195;
  local_280._16_4_ = fVar144;
  fVar145 = fVar197 * fVar197;
  local_280._20_4_ = fVar145;
  fVar146 = fVar199 * fVar199;
  local_280._24_4_ = fVar146;
  local_280._28_4_ = fVar50 + auVar167._28_4_;
  auVar227._4_4_ = fVar141 * (fStack_3b8 * fVar172 + fVar213 * fVar122 + fVar229 * fVar120);
  auVar227._0_4_ = fVar129 * (fStack_3b8 * fVar165 + fVar208 * fVar106 + fVar223 * fVar92);
  auVar227._8_4_ = fVar142 * (fStack_3b8 * fVar175 + fVar214 * fVar17 + fVar230 * fVar220);
  auVar227._12_4_ = fVar143 * (fStack_3b8 * fVar177 + fVar216 * fVar23 + fStack_324 * fVar22);
  auVar227._16_4_ = fVar144 * (fStack_3b8 * fVar179 + fVar208 * fVar29 + fVar223 * fVar28);
  auVar227._20_4_ = fVar145 * (fStack_3b8 * fVar181 + fVar213 * fVar35 + fVar229 * fVar34);
  auVar227._24_4_ = fVar146 * (fStack_3b8 * fVar183 + fVar214 * fVar41 + fVar230 * fVar40);
  auVar227._28_4_ = auVar167._28_4_ + auVar167._28_4_ + fVar105;
  fVar105 = local_500._28_4_;
  auVar234._4_4_ = auVar206._4_4_ * fVar236 * fVar113;
  auVar234._0_4_ = auVar206._0_4_ * fVar231 * fVar107;
  auVar234._8_4_ = auVar206._8_4_ * fVar237 * fVar115;
  auVar234._12_4_ = auVar206._12_4_ * fVar238 * fVar117;
  auVar234._16_4_ = auVar206._16_4_ * fVar239 * fVar119;
  auVar234._20_4_ = auVar206._20_4_ * fVar240 * fVar121;
  auVar234._24_4_ = auVar206._24_4_ * fVar241 * fVar123;
  auVar234._28_4_ = fVar105;
  auVar110 = vsubps_avx(auVar227,auVar234);
  local_4e0._4_4_ = fVar189;
  local_4e0._0_4_ = fVar185;
  fStack_4d8 = fVar191;
  fStack_4d4 = fVar193;
  fStack_4d0 = fVar195;
  fStack_4cc = fVar197;
  fStack_4c8 = fVar199;
  fStack_4c4 = fVar201;
  fVar166 = fVar185 * (float)local_5a0._0_4_;
  fVar173 = fVar189 * (float)local_5a0._4_4_;
  auVar47._4_4_ = fVar173;
  auVar47._0_4_ = fVar166;
  fVar176 = fVar191 * fStack_598;
  auVar47._8_4_ = fVar176;
  fVar178 = fVar193 * fStack_594;
  auVar47._12_4_ = fVar178;
  fVar180 = fVar195 * (float)uStack_590;
  auVar47._16_4_ = fVar180;
  fVar182 = fVar197 * uStack_590._4_4_;
  auVar47._20_4_ = fVar182;
  fVar184 = fVar199 * (float)uStack_588;
  auVar47._24_4_ = fVar184;
  auVar47._28_4_ = fVar105;
  auVar233._0_4_ = fVar166 * auVar206._0_4_ * fVar112 + auVar110._0_4_;
  auVar233._4_4_ = fVar173 * auVar206._4_4_ * fVar215 + auVar110._4_4_;
  auVar233._8_4_ = fVar176 * auVar206._8_4_ * fVar18 + auVar110._8_4_;
  auVar233._12_4_ = fVar178 * auVar206._12_4_ * fVar24 + auVar110._12_4_;
  auVar233._16_4_ = fVar180 * auVar206._16_4_ * fVar30 + auVar110._16_4_;
  auVar233._20_4_ = fVar182 * auVar206._20_4_ * fVar36 + auVar110._20_4_;
  auVar233._24_4_ = fVar184 * auVar206._24_4_ * fVar42 + auVar110._24_4_;
  auVar233._28_4_ = local_460._28_4_ + auVar110._28_4_;
  auVar48._4_4_ = fVar141 * (fVar172 * fVar172 + fVar122 * fVar122 + fVar120 * fVar120);
  auVar48._0_4_ = fVar129 * (fVar165 * fVar165 + fVar106 * fVar106 + fVar92 * fVar92);
  auVar48._8_4_ = fVar142 * (fVar175 * fVar175 + fVar17 * fVar17 + fVar220 * fVar220);
  auVar48._12_4_ = fVar143 * (fVar177 * fVar177 + fVar23 * fVar23 + fVar22 * fVar22);
  auVar48._16_4_ = fVar144 * (fVar179 * fVar179 + fVar29 * fVar29 + fVar28 * fVar28);
  auVar48._20_4_ = fVar145 * (fVar181 * fVar181 + fVar35 * fVar35 + fVar34 * fVar34);
  auVar48._24_4_ = fVar146 * (fVar183 * fVar183 + fVar41 * fVar41 + fVar40 * fVar40);
  auVar48._28_4_ = auVar110._28_4_;
  auVar49._4_4_ = fVar113 * fVar236 * fVar236;
  auVar49._0_4_ = fVar107 * fVar231 * fVar231;
  auVar49._8_4_ = fVar115 * fVar237 * fVar237;
  auVar49._12_4_ = fVar117 * fVar238 * fVar238;
  auVar49._16_4_ = fVar119 * fVar239 * fVar239;
  auVar49._20_4_ = fVar121 * fVar240 * fVar240;
  auVar49._24_4_ = fVar123 * fVar241 * fVar241;
  auVar49._28_4_ = fVar50 + fVar50 + auVar167._28_4_;
  auVar110 = vsubps_avx(auVar48,auVar49);
  auVar43._4_4_ = fVar236 * (fVar215 + fVar215);
  auVar43._0_4_ = fVar231 * (fVar112 + fVar112);
  auVar43._8_4_ = fVar237 * (fVar18 + fVar18);
  auVar43._12_4_ = fVar238 * (fVar24 + fVar24);
  auVar43._16_4_ = fVar239 * (fVar30 + fVar30);
  auVar43._20_4_ = fVar240 * (fVar36 + fVar36);
  auVar43._24_4_ = fVar241 * (fVar42 + fVar42);
  auVar43._28_4_ = auVar155._28_4_ + auVar155._28_4_;
  auVar155 = vsubps_avx(auVar43,auVar47);
  fVar147 = auVar155._28_4_;
  fVar152 = auVar206._0_4_ * auVar206._0_4_;
  fVar158 = auVar206._4_4_ * auVar206._4_4_;
  fVar159 = auVar206._8_4_ * auVar206._8_4_;
  fVar160 = auVar206._12_4_ * auVar206._12_4_;
  fVar161 = auVar206._16_4_ * auVar206._16_4_;
  fVar162 = auVar206._20_4_ * auVar206._20_4_;
  fVar163 = auVar206._24_4_ * auVar206._24_4_;
  auVar44._4_4_ = fVar113 * fVar158;
  auVar44._0_4_ = fVar107 * fVar152;
  auVar44._8_4_ = fVar115 * fVar159;
  auVar44._12_4_ = fVar117 * fVar160;
  auVar44._16_4_ = fVar119 * fVar161;
  auVar44._20_4_ = fVar121 * fVar162;
  auVar44._24_4_ = fVar123 * fVar163;
  auVar44._28_4_ = fVar147;
  auVar127 = vsubps_avx(local_280,auVar44);
  auVar45._4_4_ = auVar127._4_4_ * (auVar110._4_4_ + fVar173 * auVar155._4_4_);
  auVar45._0_4_ = auVar127._0_4_ * (auVar110._0_4_ + fVar166 * auVar155._0_4_);
  auVar45._8_4_ = auVar127._8_4_ * (auVar110._8_4_ + fVar176 * auVar155._8_4_);
  auVar45._12_4_ = auVar127._12_4_ * (auVar110._12_4_ + fVar178 * auVar155._12_4_);
  auVar45._16_4_ = auVar127._16_4_ * (auVar110._16_4_ + fVar180 * auVar155._16_4_);
  auVar45._20_4_ = auVar127._20_4_ * (auVar110._20_4_ + fVar182 * auVar155._20_4_);
  auVar45._24_4_ = auVar127._24_4_ * (auVar110._24_4_ + fVar184 * auVar155._24_4_);
  auVar45._28_4_ = auVar110._28_4_ + fVar147;
  auVar46._4_4_ = auVar233._4_4_ * auVar233._4_4_;
  auVar46._0_4_ = auVar233._0_4_ * auVar233._0_4_;
  auVar46._8_4_ = auVar233._8_4_ * auVar233._8_4_;
  auVar46._12_4_ = auVar233._12_4_ * auVar233._12_4_;
  auVar46._16_4_ = auVar233._16_4_ * auVar233._16_4_;
  auVar46._20_4_ = auVar233._20_4_ * auVar233._20_4_;
  auVar46._24_4_ = auVar233._24_4_ * auVar233._24_4_;
  auVar46._28_4_ = fVar147;
  auVar110 = vsubps_avx(auVar46,auVar45);
  auVar155 = vcmpps_avx(auVar110,ZEXT832(0) << 0x20,5);
  auVar139 = auVar155 & ~auVar89;
  if ((((((((auVar139 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar139 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar139 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar139 >> 0x7f,0) != '\0') ||
        (auVar139 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar139 >> 0xbf,0) != '\0') ||
      (auVar139 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar139[0x1f] < '\0')
  {
    auVar139 = vandnps_avx(auVar89,auVar155);
    auVar234 = vsubps_avx(auVar168,_local_520);
    auVar47 = vsubps_avx(auVar95,auVar232);
    auVar48 = vsubps_avx(auVar102,auVar205);
    fVar186 = auVar234._0_4_ * fVar174 + auVar48._0_4_ * fVar164 + auVar47._0_4_ * fVar85;
    fVar190 = auVar234._4_4_ * fVar118 + auVar48._4_4_ * fVar114 + auVar47._4_4_ * fVar116;
    fVar192 = auVar234._8_4_ * fVar219 + auVar48._8_4_ * fVar217 + auVar47._8_4_ * fVar218;
    fVar194 = auVar234._12_4_ * fVar21 + auVar48._12_4_ * fVar19 + auVar47._12_4_ * fVar20;
    fVar196 = auVar234._16_4_ * fVar27 + auVar48._16_4_ * fVar25 + auVar47._16_4_ * fVar26;
    fVar198 = auVar234._20_4_ * fVar33 + auVar48._20_4_ * fVar31 + auVar47._20_4_ * fVar32;
    fVar200 = auVar234._24_4_ * fVar39 + auVar48._24_4_ * fVar37 + auVar47._24_4_ * fVar38;
    auVar110 = vsqrtps_avx(auVar110);
    auVar155 = vrcpps_avx(auVar127);
    fVar147 = auVar155._0_4_;
    auVar225._0_4_ = auVar127._0_4_ * fVar147;
    fVar166 = auVar155._4_4_;
    auVar225._4_4_ = auVar127._4_4_ * fVar166;
    fVar173 = auVar155._8_4_;
    auVar225._8_4_ = auVar127._8_4_ * fVar173;
    fVar176 = auVar155._12_4_;
    auVar225._12_4_ = auVar127._12_4_ * fVar176;
    fVar178 = auVar155._16_4_;
    auVar225._16_4_ = auVar127._16_4_ * fVar178;
    fVar180 = auVar155._20_4_;
    auVar225._20_4_ = auVar127._20_4_ * fVar180;
    fVar182 = auVar155._24_4_;
    auVar225._24_4_ = auVar127._24_4_ * fVar182;
    auVar225._28_4_ = 0;
    auVar133._8_4_ = 0x3f800000;
    auVar133._0_8_ = 0x3f8000003f800000;
    auVar133._12_4_ = 0x3f800000;
    auVar133._16_4_ = 0x3f800000;
    auVar133._20_4_ = 0x3f800000;
    auVar133._24_4_ = 0x3f800000;
    auVar133._28_4_ = 0x3f800000;
    auVar227 = vsubps_avx(auVar133,auVar225);
    auVar103._8_4_ = 0x7fffffff;
    auVar103._0_8_ = 0x7fffffff7fffffff;
    auVar103._12_4_ = 0x7fffffff;
    auVar103._16_4_ = 0x7fffffff;
    auVar103._20_4_ = 0x7fffffff;
    auVar103._24_4_ = 0x7fffffff;
    auVar103._28_4_ = 0x7fffffff;
    fVar147 = auVar227._0_4_ * fVar147 + fVar147;
    fVar166 = auVar227._4_4_ * fVar166 + fVar166;
    fVar173 = auVar227._8_4_ * fVar173 + fVar173;
    fVar176 = auVar227._12_4_ * fVar176 + fVar176;
    fVar178 = auVar227._16_4_ * fVar178 + fVar178;
    fVar180 = auVar227._20_4_ * fVar180 + fVar180;
    fVar182 = auVar227._24_4_ * fVar182 + fVar182;
    fVar184 = auVar227._28_4_ + auVar155._28_4_;
    auVar155 = vandps_avx(auVar127,auVar103);
    auVar169._8_4_ = 0x219392ef;
    auVar169._0_8_ = 0x219392ef219392ef;
    auVar169._12_4_ = 0x219392ef;
    auVar169._16_4_ = 0x219392ef;
    auVar169._20_4_ = 0x219392ef;
    auVar169._24_4_ = 0x219392ef;
    auVar169._28_4_ = 0x219392ef;
    auVar155 = vcmpps_avx(auVar155,auVar169,2);
    uVar83 = CONCAT44(auVar233._4_4_,auVar233._0_4_);
    auVar170._0_8_ = uVar83 ^ 0x8000000080000000;
    auVar170._8_4_ = -auVar233._8_4_;
    auVar170._12_4_ = -auVar233._12_4_;
    auVar170._16_4_ = -auVar233._16_4_;
    auVar170._20_4_ = -auVar233._20_4_;
    auVar170._24_4_ = -auVar233._24_4_;
    auVar170._28_4_ = -auVar233._28_4_;
    auVar127 = vsubps_avx(auVar170,auVar110);
    auVar110 = vsubps_avx(auVar110,auVar233);
    auVar51._4_4_ = auVar127._4_4_ * fVar166;
    auVar51._0_4_ = auVar127._0_4_ * fVar147;
    auVar51._8_4_ = auVar127._8_4_ * fVar173;
    auVar51._12_4_ = auVar127._12_4_ * fVar176;
    auVar51._16_4_ = auVar127._16_4_ * fVar178;
    auVar51._20_4_ = auVar127._20_4_ * fVar180;
    auVar51._24_4_ = auVar127._24_4_ * fVar182;
    auVar51._28_4_ = auVar127._28_4_;
    auVar52._4_4_ = auVar110._4_4_ * fVar166;
    auVar52._0_4_ = auVar110._0_4_ * fVar147;
    auVar52._8_4_ = auVar110._8_4_ * fVar173;
    auVar52._12_4_ = auVar110._12_4_ * fVar176;
    auVar52._16_4_ = auVar110._16_4_ * fVar178;
    auVar52._20_4_ = auVar110._20_4_ * fVar180;
    auVar52._24_4_ = auVar110._24_4_ * fVar182;
    auVar52._28_4_ = fVar184;
    auVar90._8_4_ = 0xff800000;
    auVar90._0_8_ = 0xff800000ff800000;
    auVar90._12_4_ = 0xff800000;
    auVar90._16_4_ = 0xff800000;
    auVar90._20_4_ = 0xff800000;
    auVar90._24_4_ = 0xff800000;
    auVar90._28_4_ = 0xff800000;
    auVar110 = vblendvps_avx(auVar51,auVar90,auVar155);
    auVar96._8_4_ = 0x7f800000;
    auVar96._0_8_ = 0x7f8000007f800000;
    auVar96._12_4_ = 0x7f800000;
    auVar96._16_4_ = 0x7f800000;
    auVar96._20_4_ = 0x7f800000;
    auVar96._24_4_ = 0x7f800000;
    auVar96._28_4_ = 0x7f800000;
    auVar127 = vblendvps_avx(auVar52,auVar96,auVar155);
    auVar109._0_4_ = fVar231 + auVar206._0_4_ * auVar110._0_4_;
    auVar109._4_4_ = fVar236 + auVar206._4_4_ * auVar110._4_4_;
    auVar109._8_4_ = fVar237 + auVar206._8_4_ * auVar110._8_4_;
    auVar109._12_4_ = fVar238 + auVar206._12_4_ * auVar110._12_4_;
    auVar109._16_4_ = fVar239 + auVar206._16_4_ * auVar110._16_4_;
    auVar109._20_4_ = fVar240 + auVar206._20_4_ * auVar110._20_4_;
    auVar109._24_4_ = fVar241 + auVar206._24_4_ * auVar110._24_4_;
    auVar109._28_4_ = fVar242 + fVar184;
    auVar155 = vcmpps_avx(auVar109,ZEXT432(0) << 0x20,6);
    auVar227 = vcmpps_avx(auVar109,_local_4e0,1);
    auVar155 = vandps_avx(auVar227,auVar155);
    auVar155 = vandps_avx(auVar139,auVar155);
    local_380 = vblendvps_avx(auVar96,auVar110,auVar155);
    local_3a0._0_4_ = fVar231 + auVar206._0_4_ * auVar127._0_4_;
    local_3a0._4_4_ = fVar236 + auVar206._4_4_ * auVar127._4_4_;
    fStack_398 = fVar237 + auVar206._8_4_ * auVar127._8_4_;
    fStack_394 = fVar238 + auVar206._12_4_ * auVar127._12_4_;
    fStack_390 = fVar239 + auVar206._16_4_ * auVar127._16_4_;
    fStack_38c = fVar240 + auVar206._20_4_ * auVar127._20_4_;
    fStack_388 = fVar241 + auVar206._24_4_ * auVar127._24_4_;
    register0x000012dc = fVar242 + auVar155._28_4_;
    auVar155 = vcmpps_avx(_local_3a0,ZEXT432(0) << 0x20,6);
    auVar227 = vcmpps_avx(_local_3a0,_local_4e0,1);
    auVar155 = vandps_avx(auVar227,auVar155);
    auVar155 = vandps_avx(auVar139,auVar155);
    _local_520 = vblendvps_avx(auVar90,auVar127,auVar155);
    auVar127 = vrcpps_avx(auVar206);
    fVar147 = auVar127._0_4_;
    fVar166 = auVar127._4_4_;
    auVar53._4_4_ = auVar206._4_4_ * fVar166;
    auVar53._0_4_ = auVar206._0_4_ * fVar147;
    fVar173 = auVar127._8_4_;
    auVar53._8_4_ = auVar206._8_4_ * fVar173;
    fVar176 = auVar127._12_4_;
    auVar53._12_4_ = auVar206._12_4_ * fVar176;
    fVar178 = auVar127._16_4_;
    auVar53._16_4_ = auVar206._16_4_ * fVar178;
    fVar180 = auVar127._20_4_;
    auVar53._20_4_ = auVar206._20_4_ * fVar180;
    fVar182 = auVar127._24_4_;
    auVar53._24_4_ = auVar206._24_4_ * fVar182;
    auVar53._28_4_ = auVar155._28_4_;
    auVar155 = vsubps_avx(auVar133,auVar53);
    fVar147 = fVar147 + fVar147 * auVar155._0_4_;
    fVar166 = fVar166 + fVar166 * auVar155._4_4_;
    fVar173 = fVar173 + fVar173 * auVar155._8_4_;
    fVar176 = fVar176 + fVar176 * auVar155._12_4_;
    fVar178 = fVar178 + fVar178 * auVar155._16_4_;
    fVar180 = fVar180 + fVar180 * auVar155._20_4_;
    fVar182 = fVar182 + fVar182 * auVar155._24_4_;
    auVar54._4_4_ = auVar206._4_4_ * fVar172;
    auVar54._0_4_ = auVar206._0_4_ * fVar165;
    auVar54._8_4_ = auVar206._8_4_ * fVar175;
    auVar54._12_4_ = auVar206._12_4_ * fVar177;
    auVar54._16_4_ = auVar206._16_4_ * fVar179;
    auVar54._20_4_ = auVar206._20_4_ * fVar181;
    auVar54._24_4_ = auVar206._24_4_ * fVar183;
    auVar54._28_4_ = auVar155._28_4_;
    auVar55._4_4_ = fVar236 * fStack_3b8;
    auVar55._0_4_ = fVar231 * fStack_3b8;
    auVar55._8_4_ = fVar237 * fStack_3b8;
    auVar55._12_4_ = fVar238 * fStack_3b8;
    auVar55._16_4_ = fVar239 * fStack_3b8;
    auVar55._20_4_ = fVar240 * fStack_3b8;
    auVar55._24_4_ = fVar241 * fStack_3b8;
    auVar55._28_4_ = auVar227._28_4_;
    auVar155 = vsubps_avx(auVar54,auVar55);
    auVar56._4_4_ = auVar206._4_4_ * fVar122;
    auVar56._0_4_ = auVar206._0_4_ * fVar106;
    auVar56._8_4_ = auVar206._8_4_ * fVar17;
    auVar56._12_4_ = auVar206._12_4_ * fVar23;
    auVar56._16_4_ = auVar206._16_4_ * fVar29;
    auVar56._20_4_ = auVar206._20_4_ * fVar35;
    auVar56._24_4_ = auVar206._24_4_ * fVar41;
    auVar56._28_4_ = auVar227._28_4_;
    auVar57._4_4_ = fVar236 * fVar213;
    auVar57._0_4_ = fVar231 * fVar208;
    auVar57._8_4_ = fVar237 * fVar214;
    auVar57._12_4_ = fVar238 * fVar216;
    auVar57._16_4_ = fVar239 * fVar208;
    auVar57._20_4_ = fVar240 * fVar213;
    auVar57._24_4_ = fVar241 * fVar214;
    auVar57._28_4_ = auVar110._28_4_;
    auVar127 = vsubps_avx(auVar56,auVar57);
    auVar58._4_4_ = auVar206._4_4_ * fVar120;
    auVar58._0_4_ = auVar206._0_4_ * fVar92;
    auVar58._8_4_ = auVar206._8_4_ * fVar220;
    auVar58._12_4_ = auVar206._12_4_ * fVar22;
    auVar58._16_4_ = auVar206._16_4_ * fVar28;
    auVar58._20_4_ = auVar206._20_4_ * fVar34;
    auVar58._24_4_ = auVar206._24_4_ * fVar40;
    auVar58._28_4_ = auVar110._28_4_;
    auVar59._4_4_ = fVar229 * fVar236;
    auVar59._0_4_ = fVar223 * fVar231;
    auVar59._8_4_ = fVar230 * fVar237;
    auVar59._12_4_ = fStack_324 * fVar238;
    auVar59._16_4_ = fVar223 * fVar239;
    auVar59._20_4_ = fVar229 * fVar240;
    auVar59._24_4_ = fVar230 * fVar241;
    auVar59._28_4_ = 0x3f800000;
    auVar110 = vsubps_avx(auVar58,auVar59);
    auVar134._0_4_ =
         auVar155._0_4_ * auVar155._0_4_ +
         auVar127._0_4_ * auVar127._0_4_ + auVar110._0_4_ * auVar110._0_4_;
    auVar134._4_4_ =
         auVar155._4_4_ * auVar155._4_4_ +
         auVar127._4_4_ * auVar127._4_4_ + auVar110._4_4_ * auVar110._4_4_;
    auVar134._8_4_ =
         auVar155._8_4_ * auVar155._8_4_ +
         auVar127._8_4_ * auVar127._8_4_ + auVar110._8_4_ * auVar110._8_4_;
    auVar134._12_4_ =
         auVar155._12_4_ * auVar155._12_4_ +
         auVar127._12_4_ * auVar127._12_4_ + auVar110._12_4_ * auVar110._12_4_;
    auVar134._16_4_ =
         auVar155._16_4_ * auVar155._16_4_ +
         auVar127._16_4_ * auVar127._16_4_ + auVar110._16_4_ * auVar110._16_4_;
    auVar134._20_4_ =
         auVar155._20_4_ * auVar155._20_4_ +
         auVar127._20_4_ * auVar127._20_4_ + auVar110._20_4_ * auVar110._20_4_;
    auVar134._24_4_ =
         auVar155._24_4_ * auVar155._24_4_ +
         auVar127._24_4_ * auVar127._24_4_ + auVar110._24_4_ * auVar110._24_4_;
    auVar134._28_4_ = auVar155._28_4_ + auVar127._28_4_ + auVar110._28_4_;
    auVar60._4_4_ = fVar158 * (float)local_5a0._4_4_ * (float)local_5a0._4_4_;
    auVar60._0_4_ = fVar152 * (float)local_5a0._0_4_ * (float)local_5a0._0_4_;
    auVar60._8_4_ = fVar159 * fStack_598 * fStack_598;
    auVar60._12_4_ = fVar160 * fStack_594 * fStack_594;
    auVar60._16_4_ = fVar161 * (float)uStack_590 * (float)uStack_590;
    auVar60._20_4_ = fVar162 * uStack_590._4_4_ * uStack_590._4_4_;
    auVar60._24_4_ = fVar163 * (float)uStack_588 * (float)uStack_588;
    auVar60._28_4_ = auVar155._28_4_;
    auVar155 = vcmpps_avx(auVar134,auVar60,1);
    auVar61._4_4_ = fVar166 * -fVar236;
    auVar61._0_4_ = fVar147 * -fVar231;
    auVar61._8_4_ = fVar173 * -fVar237;
    auVar61._12_4_ = fVar176 * -fVar238;
    auVar61._16_4_ = fVar178 * -fVar239;
    auVar61._20_4_ = fVar180 * -fVar240;
    auVar61._24_4_ = fVar182 * -fVar241;
    auVar61._28_4_ = -fVar242;
    auVar110 = vblendvps_avx(auVar96,auVar61,auVar155);
    auVar150._16_16_ = *(undefined1 (*) [16])(mm_lookupmask_ps + (line->leftExists & 0xfffffff0));
    auVar150._0_16_ = *(undefined1 (*) [16])(mm_lookupmask_ps + ((line->leftExists & 0xf) << 4));
    auVar155 = vandnps_avx(auVar150,auVar139);
    auVar127 = vblendvps_avx(auVar96,auVar110,auVar155);
    auVar135._16_16_ = *(undefined1 (*) [16])(mm_lookupmask_ps + (line->rightExists & 0xfffffff0));
    auVar135._0_16_ = *(undefined1 (*) [16])(mm_lookupmask_ps + ((line->rightExists & 0xf) << 4));
    auVar62._4_4_ = auVar206._4_4_ * auVar234._4_4_;
    auVar62._0_4_ = auVar206._0_4_ * auVar234._0_4_;
    auVar62._8_4_ = auVar206._8_4_ * auVar234._8_4_;
    auVar62._12_4_ = auVar206._12_4_ * auVar234._12_4_;
    auVar62._16_4_ = auVar206._16_4_ * auVar234._16_4_;
    auVar62._20_4_ = auVar206._20_4_ * auVar234._20_4_;
    auVar62._24_4_ = auVar206._24_4_ * auVar234._24_4_;
    auVar62._28_4_ = auVar155._28_4_;
    auVar63._4_4_ = auVar206._4_4_ * auVar47._4_4_;
    auVar63._0_4_ = auVar206._0_4_ * auVar47._0_4_;
    auVar63._8_4_ = auVar206._8_4_ * auVar47._8_4_;
    auVar63._12_4_ = auVar206._12_4_ * auVar47._12_4_;
    auVar63._16_4_ = auVar206._16_4_ * auVar47._16_4_;
    auVar63._20_4_ = auVar206._20_4_ * auVar47._20_4_;
    auVar63._24_4_ = auVar206._24_4_ * auVar47._24_4_;
    auVar63._28_4_ = auVar47._28_4_;
    auVar64._4_4_ = auVar206._4_4_ * auVar48._4_4_;
    auVar64._0_4_ = auVar206._0_4_ * auVar48._0_4_;
    auVar64._8_4_ = auVar206._8_4_ * auVar48._8_4_;
    auVar64._12_4_ = auVar206._12_4_ * auVar48._12_4_;
    auVar64._16_4_ = auVar206._16_4_ * auVar48._16_4_;
    auVar64._20_4_ = auVar206._20_4_ * auVar48._20_4_;
    auVar64._24_4_ = auVar206._24_4_ * auVar48._24_4_;
    auVar64._28_4_ = 0;
    auVar65._4_4_ = fVar190 * fStack_3b8;
    auVar65._0_4_ = fVar186 * fStack_3b8;
    auVar65._8_4_ = fVar192 * fStack_3b8;
    auVar65._12_4_ = fVar194 * fStack_3b8;
    auVar65._16_4_ = fVar196 * fStack_3b8;
    auVar65._20_4_ = fVar198 * fStack_3b8;
    uVar81 = auVar48._28_4_;
    auVar65._24_4_ = fVar200 * fStack_3b8;
    auVar65._28_4_ = uVar81;
    auVar155 = vsubps_avx(auVar62,auVar65);
    auVar66._4_4_ = fVar190 * fVar213;
    auVar66._0_4_ = fVar186 * fVar208;
    auVar66._8_4_ = fVar192 * fVar214;
    auVar66._12_4_ = fVar194 * fVar216;
    auVar66._16_4_ = fVar196 * fVar208;
    auVar66._20_4_ = fVar198 * fVar213;
    auVar66._24_4_ = fVar200 * fVar214;
    auVar66._28_4_ = uVar81;
    auVar110 = vsubps_avx(auVar63,auVar66);
    auVar67._4_4_ = fVar229 * fVar190;
    auVar67._0_4_ = fVar223 * fVar186;
    auVar67._8_4_ = fVar230 * fVar192;
    auVar67._12_4_ = fStack_324 * fVar194;
    auVar67._16_4_ = fVar223 * fVar196;
    auVar67._20_4_ = fVar229 * fVar198;
    auVar67._24_4_ = fVar230 * fVar200;
    auVar67._28_4_ = uVar81;
    auVar227 = vsubps_avx(auVar64,auVar67);
    auVar91._0_4_ =
         auVar155._0_4_ * auVar155._0_4_ +
         auVar110._0_4_ * auVar110._0_4_ + auVar227._0_4_ * auVar227._0_4_;
    auVar91._4_4_ =
         auVar155._4_4_ * auVar155._4_4_ +
         auVar110._4_4_ * auVar110._4_4_ + auVar227._4_4_ * auVar227._4_4_;
    auVar91._8_4_ =
         auVar155._8_4_ * auVar155._8_4_ +
         auVar110._8_4_ * auVar110._8_4_ + auVar227._8_4_ * auVar227._8_4_;
    auVar91._12_4_ =
         auVar155._12_4_ * auVar155._12_4_ +
         auVar110._12_4_ * auVar110._12_4_ + auVar227._12_4_ * auVar227._12_4_;
    auVar91._16_4_ =
         auVar155._16_4_ * auVar155._16_4_ +
         auVar110._16_4_ * auVar110._16_4_ + auVar227._16_4_ * auVar227._16_4_;
    auVar91._20_4_ =
         auVar155._20_4_ * auVar155._20_4_ +
         auVar110._20_4_ * auVar110._20_4_ + auVar227._20_4_ * auVar227._20_4_;
    auVar91._24_4_ =
         auVar155._24_4_ * auVar155._24_4_ +
         auVar110._24_4_ * auVar110._24_4_ + auVar227._24_4_ * auVar227._24_4_;
    auVar91._28_4_ = auVar110._28_4_ + auVar110._28_4_ + auVar227._28_4_;
    auVar99 = SUB3216(*(undefined1 (*) [32])((long)&(ray->org).field_0 + 0xc),0);
    auVar99 = vshufps_avx(auVar99,auVar99,0);
    auVar126._16_16_ = auVar99;
    auVar126._0_16_ = auVar99;
    auVar155 = vandnps_avx(auVar135,auVar139);
    auVar68._4_4_ = fVar158 * auVar86._4_4_ * auVar86._4_4_;
    auVar68._0_4_ = fVar152 * auVar86._0_4_ * auVar86._0_4_;
    auVar68._8_4_ = fVar159 * auVar86._8_4_ * auVar86._8_4_;
    auVar68._12_4_ = fVar160 * auVar86._12_4_ * auVar86._12_4_;
    auVar68._16_4_ = fVar161 * auVar88._16_4_ * auVar88._16_4_;
    auVar68._20_4_ = fVar162 * auVar88._20_4_ * auVar88._20_4_;
    auVar68._24_4_ = fVar163 * auVar88._24_4_ * auVar88._24_4_;
    auVar68._28_4_ = auVar88._28_4_;
    auVar110 = vcmpps_avx(auVar91,auVar68,1);
    auVar69._4_4_ = fVar166 * -fVar190;
    auVar69._0_4_ = fVar147 * -fVar186;
    auVar69._8_4_ = fVar173 * -fVar192;
    auVar69._12_4_ = fVar176 * -fVar194;
    auVar69._16_4_ = fVar178 * -fVar196;
    auVar69._20_4_ = fVar180 * -fVar198;
    auVar69._24_4_ = fVar182 * -fVar200;
    auVar69._28_4_ = fVar216;
    auVar110 = vblendvps_avx(auVar96,auVar69,auVar110);
    auVar155 = vblendvps_avx(auVar96,auVar110,auVar155);
    auVar234 = vminps_avx(auVar127,auVar155);
    auVar110 = vmaxps_avx(auVar127,auVar155);
    auVar47 = vminps_avx(local_380,auVar234);
    auVar227 = vcmpps_avx(auVar47,auVar234,0);
    auVar155 = vcmpps_avx(auVar110,auVar96,0);
    auVar207._8_4_ = 0xff800000;
    auVar207._0_8_ = 0xff800000ff800000;
    auVar207._12_4_ = 0xff800000;
    auVar207._16_4_ = 0xff800000;
    auVar207._20_4_ = 0xff800000;
    auVar207._24_4_ = 0xff800000;
    auVar207._28_4_ = 0xff800000;
    auVar155 = vblendvps_avx(auVar110,auVar207,auVar155);
    auVar110 = vcmpps_avx(auVar234,auVar96,0);
    auVar110 = vblendvps_avx(auVar234,auVar207,auVar110);
    auVar110 = vblendvps_avx(auVar110,auVar155,auVar227);
    auVar136._0_4_ = fVar98 + auVar47._0_4_;
    auVar136._4_4_ = fVar104 + auVar47._4_4_;
    auVar136._8_4_ = fStack_358 + auVar47._8_4_;
    auVar136._12_4_ = fStack_354 + auVar47._12_4_;
    auVar136._16_4_ = fStack_350 + auVar47._16_4_;
    auVar136._20_4_ = fStack_34c + auVar47._20_4_;
    auVar136._24_4_ = fStack_348 + auVar47._24_4_;
    auVar136._28_4_ = fStack_344 + auVar47._28_4_;
    auVar155 = vcmpps_avx(auVar126,auVar136,2);
    local_170._0_4_ = ray->tfar;
    local_170._4_4_ = ray->mask;
    local_170._8_4_ = ray->id;
    local_170._12_4_ = ray->flags;
    auVar99 = vshufps_avx(local_170,local_170,0);
    auVar153._16_16_ = auVar99;
    auVar153._0_16_ = auVar99;
    auVar227 = vcmpps_avx(auVar136,auVar153,2);
    auVar155 = vandps_avx(auVar227,auVar155);
    local_3e0 = vmaxps_avx(_local_520,auVar110);
    auVar110 = vcmpps_avx(auVar47,auVar96,4);
    auVar110 = vandps_avx(auVar139,auVar110);
    local_400 = vandps_avx(auVar155,auVar110);
    local_540._0_4_ = fVar98 + local_3e0._0_4_;
    local_540._4_4_ = fVar104 + local_3e0._4_4_;
    fStack_538 = fStack_358 + local_3e0._8_4_;
    fStack_534 = fStack_354 + local_3e0._12_4_;
    fStack_530 = fStack_350 + local_3e0._16_4_;
    fStack_52c = fStack_34c + local_3e0._20_4_;
    fStack_528 = fStack_348 + local_3e0._24_4_;
    register0x0000135c = fStack_344 + local_3e0._28_4_;
    auVar155 = vcmpps_avx(auVar126,_local_540,2);
    auVar110 = vcmpps_avx(_local_540,auVar153,2);
    auVar155 = vandps_avx(auVar110,auVar155);
    auVar110 = vcmpps_avx(auVar207,local_3e0,4);
    auVar110 = vandps_avx(auVar139,auVar110);
    local_420 = vandps_avx(auVar155,auVar110);
    local_2a0 = vorps_avx(local_400,local_420);
    if ((((((((local_2a0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_2a0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_2a0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_2a0 >> 0x7f,0) != '\0') ||
          (local_2a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_2a0 >> 0xbf,0) != '\0') ||
        (local_2a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_2a0[0x1f] < '\0') {
      auVar227 = vblendvps_avx(local_3e0,auVar47,local_400);
      auVar234 = vblendvps_avx(_local_3a0,auVar109,local_400);
      fVar160 = fVar185 * fVar112 * (float)local_5a0._0_4_;
      fVar161 = fVar189 * fVar215 * (float)local_5a0._4_4_;
      fVar162 = fVar191 * fVar18 * fStack_598;
      fVar163 = fVar193 * fVar24 * fStack_594;
      fVar166 = fVar195 * fVar30 * (float)uStack_590;
      fVar173 = fVar197 * fVar36 * uStack_590._4_4_;
      fVar176 = fVar199 * fVar42 * (float)uStack_588;
      auVar155 = vcmpps_avx(local_380,auVar227,0);
      auVar110 = vcmpps_avx(auVar227,_local_520,0);
      auVar155 = vorps_avx(auVar155,auVar110);
      auVar155 = vandps_avx(auVar139,auVar155);
      _local_5a0 = auVar127;
      auVar127 = vcmpps_avx(auVar127,auVar227,0);
      auVar110 = vandps_avx(auVar139,auVar127);
      fVar112 = auVar227._0_4_;
      fVar18 = auVar227._4_4_;
      fVar30 = auVar227._8_4_;
      fVar36 = auVar227._12_4_;
      fVar42 = auVar227._16_4_;
      fVar147 = auVar227._20_4_;
      fVar158 = auVar227._24_4_;
      auVar212 = ZEXT3264(local_280);
      fStack_31c = fVar118 * fVar161;
      local_320 = fVar174 * fVar160;
      fStack_318 = fVar219 * fVar162;
      fStack_314 = fVar21 * fVar163;
      fStack_310 = fVar27 * fVar166;
      fStack_30c = fVar33 * fVar173;
      fStack_308 = fVar39 * fVar176;
      fStack_304 = local_400._28_4_;
      auVar137._0_4_ = fVar174 * fVar160 + fVar129 * (fStack_3b8 * fVar112 + fVar165);
      auVar137._4_4_ = fVar118 * fVar161 + fVar141 * (fStack_3b8 * fVar18 + fVar172);
      auVar137._8_4_ = fVar219 * fVar162 + fVar142 * (fStack_3b8 * fVar30 + fVar175);
      auVar137._12_4_ = fVar21 * fVar163 + fVar143 * (fStack_3b8 * fVar36 + fVar177);
      auVar137._16_4_ = fVar27 * fVar166 + fVar144 * (fStack_3b8 * fVar42 + fVar179);
      auVar137._20_4_ = fVar33 * fVar173 + fVar145 * (fStack_3b8 * fVar147 + fVar181);
      auVar137._24_4_ = fVar39 * fVar176 + fVar146 * (fStack_3b8 * fVar158 + fVar183);
      auVar137._28_4_ = local_400._28_4_ + auVar127._28_4_ + fVar105;
      fStack_33c = fVar113 * fVar118;
      local_340 = fVar107 * fVar174;
      fStack_338 = fVar115 * fVar219;
      fStack_334 = fVar117 * fVar21;
      fStack_330 = fVar119 * fVar27;
      fStack_32c = fVar121 * fVar33;
      fStack_328 = fVar123 * fVar39;
      fVar215 = auVar234._0_4_;
      fVar24 = auVar234._4_4_;
      auVar70._4_4_ = fVar113 * fVar118 * fVar24;
      auVar70._0_4_ = fVar107 * fVar174 * fVar215;
      fVar174 = auVar234._8_4_;
      auVar70._8_4_ = fVar115 * fVar219 * fVar174;
      fVar118 = auVar234._12_4_;
      auVar70._12_4_ = fVar117 * fVar21 * fVar118;
      fVar105 = auVar234._16_4_;
      auVar70._16_4_ = fVar119 * fVar27 * fVar105;
      fVar152 = auVar234._20_4_;
      auVar70._20_4_ = fVar121 * fVar33 * fVar152;
      fVar159 = auVar234._24_4_;
      auVar70._24_4_ = fVar123 * fVar39 * fVar159;
      auVar70._28_4_ = fStack_324;
      auVar139 = vsubps_avx(auVar137,auVar70);
      local_c0._0_8_ = local_4c0._0_8_ ^ 0x8000000080000000;
      local_c0._8_4_ = -fVar219;
      local_c0._12_4_ = -fVar21;
      local_c0._16_4_ = -fVar27;
      local_c0._20_4_ = -fVar33;
      local_c0._24_4_ = -fVar39;
      local_c0._28_4_ = local_4c0._28_4_ ^ 0x80000000;
      auVar127 = vblendvps_avx(local_4c0,local_c0,auVar110);
      local_2c0 = vblendvps_avx(auVar127,auVar139,auVar155);
      auVar128 = ZEXT3264(local_460);
      fStack_84 = local_380._28_4_;
      local_a0 = fVar85 * fVar160;
      fStack_9c = fVar116 * fVar161;
      fStack_98 = fVar218 * fVar162;
      fStack_94 = fVar20 * fVar163;
      fStack_90 = fVar26 * fVar166;
      fStack_8c = fVar32 * fVar173;
      fStack_88 = fVar38 * fVar176;
      auVar138._0_4_ = fVar85 * fVar160 + fVar129 * (fVar106 + fVar208 * fVar112);
      auVar138._4_4_ = fVar116 * fVar161 + fVar141 * (fVar122 + fVar213 * fVar18);
      auVar138._8_4_ = fVar218 * fVar162 + fVar142 * (fVar17 + fVar214 * fVar30);
      auVar138._12_4_ = fVar20 * fVar163 + fVar143 * (fVar23 + fVar216 * fVar36);
      auVar138._16_4_ = fVar26 * fVar166 + fVar144 * (fVar29 + fVar208 * fVar42);
      auVar138._20_4_ = fVar32 * fVar173 + fVar145 * (fVar35 + fVar213 * fVar147);
      auVar138._24_4_ = fVar38 * fVar176 + fVar146 * (fVar41 + fVar214 * fVar158);
      auVar138._28_4_ = fStack_84 + local_560._28_4_ + auVar139._28_4_;
      local_80 = fVar107 * fVar85;
      fStack_7c = fVar113 * fVar116;
      fStack_78 = fVar115 * fVar218;
      fStack_74 = fVar117 * fVar20;
      fStack_70 = fVar119 * fVar26;
      fStack_6c = fVar121 * fVar32;
      fStack_68 = fVar123 * fVar38;
      fStack_64 = fStack_84;
      auVar71._4_4_ = fVar113 * fVar116 * fVar24;
      auVar71._0_4_ = fVar107 * fVar85 * fVar215;
      auVar71._8_4_ = fVar115 * fVar218 * fVar174;
      auVar71._12_4_ = fVar117 * fVar20 * fVar118;
      auVar71._16_4_ = fVar119 * fVar26 * fVar105;
      auVar71._20_4_ = fVar121 * fVar32 * fVar152;
      auVar71._24_4_ = fVar123 * fVar38 * fVar159;
      auVar71._28_4_ = fStack_84;
      auVar139 = vsubps_avx(auVar138,auVar71);
      local_120._0_8_ = local_460._0_8_ ^ 0x8000000080000000;
      local_120._8_4_ = -fVar218;
      local_120._12_4_ = -fVar20;
      local_120._16_4_ = -fVar26;
      local_120._20_4_ = -fVar32;
      local_120._24_4_ = -fVar38;
      local_120._28_4_ = -local_460._28_4_;
      auVar127 = vblendvps_avx(local_460,local_120,auVar110);
      local_2e0 = vblendvps_avx(auVar127,auVar139,auVar155);
      auVar140 = ZEXT3264(local_480);
      auVar222 = ZEXT3264(local_440);
      auVar235 = ZEXT3264(local_4a0);
      local_e0 = fVar164 * fVar160;
      fStack_dc = fVar114 * fVar161;
      fStack_d8 = fVar217 * fVar162;
      fStack_d4 = fVar19 * fVar163;
      fStack_d0 = fVar25 * fVar166;
      fStack_cc = fVar31 * fVar173;
      fStack_c8 = fVar37 * fVar176;
      fStack_c4 = auVar127._28_4_;
      auVar154._0_4_ = fVar164 * fVar160 + fVar129 * (fVar92 + fVar223 * fVar112);
      auVar154._4_4_ = fVar114 * fVar161 + fVar141 * (fVar120 + fVar229 * fVar18);
      auVar154._8_4_ = fVar217 * fVar162 + fVar142 * (fVar220 + fVar230 * fVar30);
      auVar154._12_4_ = fVar19 * fVar163 + fVar143 * (fVar22 + fStack_324 * fVar36);
      auVar154._16_4_ = fVar25 * fVar166 + fVar144 * (fVar28 + fVar223 * fVar42);
      auVar154._20_4_ = fVar31 * fVar173 + fVar145 * (fVar34 + fVar229 * fVar147);
      auVar154._24_4_ = fVar37 * fVar176 + fVar146 * (fVar40 + fVar230 * fVar158);
      auVar154._28_4_ = auVar127._28_4_ + fVar50 + local_2a0._28_4_;
      auVar139 = vrcpps_avx(_local_4e0);
      local_300 = fVar107 * fVar164;
      fStack_2fc = fVar113 * fVar114;
      fStack_2f8 = fVar115 * fVar217;
      fStack_2f4 = fVar117 * fVar19;
      fStack_2f0 = fVar119 * fVar25;
      fStack_2ec = fVar121 * fVar31;
      fStack_2e8 = fVar123 * fVar37;
      uStack_2e4 = 0x80000000;
      auVar72._4_4_ = fVar113 * fVar114 * fVar24;
      auVar72._0_4_ = fVar107 * fVar164 * fVar215;
      auVar72._8_4_ = fVar115 * fVar217 * fVar174;
      auVar72._12_4_ = fVar117 * fVar19 * fVar118;
      auVar72._16_4_ = fVar119 * fVar25 * fVar105;
      auVar72._20_4_ = fVar121 * fVar31 * fVar152;
      auVar72._24_4_ = fVar123 * fVar37 * fVar159;
      auVar72._28_4_ = 0x80000000;
      auVar234 = vsubps_avx(auVar154,auVar72);
      local_140._0_8_ = local_480._0_8_ ^ 0x8000000080000000;
      local_140._8_4_ = -fVar217;
      local_140._12_4_ = -fVar19;
      local_140._16_4_ = -fVar25;
      local_140._20_4_ = -fVar31;
      local_140._24_4_ = -fVar37;
      local_140._28_4_ = local_480._28_4_ ^ 0x80000000;
      auVar127 = vblendvps_avx(local_480,local_140,auVar110);
      local_1a0 = vblendvps_avx(auVar127,auVar234,auVar155);
      auVar157 = ZEXT3264(local_1a0);
      local_100 = auVar139._0_4_;
      fStack_fc = auVar139._4_4_;
      auVar73._4_4_ = fStack_fc * fVar189;
      auVar73._0_4_ = local_100 * fVar185;
      fStack_f8 = auVar139._8_4_;
      auVar73._8_4_ = fStack_f8 * fVar191;
      fStack_f4 = auVar139._12_4_;
      auVar73._12_4_ = fStack_f4 * fVar193;
      fStack_f0 = auVar139._16_4_;
      auVar73._16_4_ = fStack_f0 * fVar195;
      fStack_ec = auVar139._20_4_;
      auVar73._20_4_ = fStack_ec * fVar197;
      fStack_e8 = auVar139._24_4_;
      auVar73._24_4_ = fStack_e8 * fVar199;
      auVar73._28_4_ = fVar201;
      auVar226._8_4_ = 0x3f800000;
      auVar226._0_8_ = 0x3f8000003f800000;
      auVar226._12_4_ = 0x3f800000;
      auVar226._16_4_ = 0x3f800000;
      auVar226._20_4_ = 0x3f800000;
      auVar226._24_4_ = 0x3f800000;
      auVar226._28_4_ = 0x3f800000;
      auVar127 = vsubps_avx(auVar226,auVar73);
      _local_4e0 = vblendvps_avx(auVar226,ZEXT832(0) << 0x20,auVar110);
      local_100 = local_100 + local_100 * auVar127._0_4_;
      fStack_fc = fStack_fc + fStack_fc * auVar127._4_4_;
      fStack_f8 = fStack_f8 + fStack_f8 * auVar127._8_4_;
      fStack_f4 = fStack_f4 + fStack_f4 * auVar127._12_4_;
      fStack_f0 = fStack_f0 + fStack_f0 * auVar127._16_4_;
      fStack_ec = fStack_ec + fStack_ec * auVar127._20_4_;
      fStack_e8 = fStack_e8 + fStack_e8 * auVar127._24_4_;
      fStack_e4 = auVar139._28_4_ + auVar127._28_4_;
      auVar74._4_4_ = fVar24 * fStack_fc;
      auVar74._0_4_ = fVar215 * local_100;
      auVar74._8_4_ = fVar174 * fStack_f8;
      auVar74._12_4_ = fVar118 * fStack_f4;
      auVar74._16_4_ = fVar105 * fStack_f0;
      auVar74._20_4_ = fVar152 * fStack_ec;
      auVar74._24_4_ = fVar159 * fStack_e8;
      auVar74._28_4_ = fStack_e4;
      local_240 = vblendvps_avx(_local_4e0,auVar74,auVar155);
      local_220 = ZEXT832(0) << 0x20;
      local_200._4_4_ = fVar18 + fVar104;
      local_200._0_4_ = fVar112 + fVar98;
      fStack_1f8 = fVar30 + fStack_358;
      fStack_1f4 = fVar36 + fStack_354;
      fStack_1f0 = fVar42 + fStack_350;
      fStack_1ec = fVar147 + fStack_34c;
      fStack_1e8 = fVar158 + fStack_348;
      fStack_1e4 = auVar227._28_4_ + fStack_344;
      local_1e0 = local_2c0;
      local_1c0 = local_2e0;
      uVar81 = vmovmskps_avx(local_2a0);
      uVar83 = CONCAT44((int)((ulong)lVar82 >> 0x20),uVar81);
      auVar188 = ZEXT3264(_local_560);
      auVar228 = ZEXT3264(local_500);
      auVar111 = ZEXT3264(local_4c0);
      do {
        auVar155 = auVar157._0_32_;
        auVar209 = auVar212._0_28_;
        auVar221 = auVar222._0_28_;
        fVar164 = auVar157._28_4_;
        uVar16 = 0;
        if (uVar83 != 0) {
          for (; (uVar83 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
          }
        }
        pGVar12 = (pSVar80->geometries).items[*(uint *)(local_260 + uVar16 * 4)].ptr;
        if ((pGVar12->mask & ray->mask) != 0) {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (bVar84 = true, auVar110 = auVar111._0_32_, auVar127 = auVar128._0_32_,
             auVar139 = auVar140._0_32_, auVar227 = auVar228._0_32_, auVar234 = auVar235._0_32_,
             pGVar12->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_010ee0f8;
          local_600 = *(undefined4 *)(local_1e0 + uVar16 * 4);
          local_5fc = *(undefined4 *)(local_1c0 + uVar16 * 4);
          local_5f8 = *(undefined4 *)(local_1a0 + uVar16 * 4);
          local_5f4 = *(undefined4 *)(local_240 + uVar16 * 4);
          local_5f0 = *(undefined4 *)(local_220 + uVar16 * 4);
          local_5ec = (local_578->primIDs).field_0.i[uVar16];
          local_5e8 = *(uint *)(local_260 + uVar16 * 4);
          local_5e4 = context->user->instID[0];
          local_5e0 = context->user->instPrimID[0];
          ray->tfar = *(float *)(local_200 + uVar16 * 4);
          local_60c = -1;
          local_5d0.valid = &local_60c;
          local_5d0.geometryUserPtr = pGVar12->userPtr;
          local_5d0.context = context->user;
          local_5d0.ray = (RTCRayN *)ray;
          local_5d0.hit = (RTCHitN *)&local_600;
          local_5d0.N = 1;
          if (pGVar12->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_010ee034:
            fVar164 = auVar155._28_4_;
            p_Var15 = context->args->filter;
            if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
              auVar157 = ZEXT1664(auVar155._0_16_);
              (*p_Var15)(&local_5d0);
              fVar164 = auVar157._28_4_;
              context = local_608;
              if (*local_5d0.valid == 0) goto LAB_010ee076;
            }
            bVar84 = true;
            auVar221 = local_440._0_28_;
            auVar188 = ZEXT3264(_local_560);
            auVar209 = local_280._0_28_;
            auVar110 = local_4c0;
            auVar127 = local_460;
            auVar139 = local_480;
            auVar227 = local_500;
            auVar234 = local_4a0;
            goto LAB_010ee0f8;
          }
          auVar157 = ZEXT1664(auVar157._0_16_);
          (*pGVar12->occlusionFilterN)(&local_5d0);
          auVar155 = auVar157._0_32_;
          context = local_608;
          if (*local_5d0.valid != 0) goto LAB_010ee034;
LAB_010ee076:
          ray->tfar = (float)local_170._0_4_;
          auVar222 = ZEXT3264(local_440);
          auVar128 = ZEXT3264(local_460);
          auVar140 = ZEXT3264(local_480);
          auVar188 = ZEXT3264(_local_560);
          auVar235 = ZEXT3264(local_4a0);
          auVar228 = ZEXT3264(local_500);
          auVar111 = ZEXT3264(local_4c0);
          auVar212 = ZEXT3264(local_280);
          pSVar80 = local_570;
          context = local_608;
        }
        auVar209 = auVar212._0_28_;
        auVar221 = auVar222._0_28_;
        fVar164 = auVar157._28_4_;
        uVar83 = uVar83 ^ 1L << (uVar16 & 0x3f);
      } while (uVar83 != 0);
      bVar84 = false;
      auVar110 = auVar111._0_32_;
      auVar127 = auVar128._0_32_;
      auVar139 = auVar140._0_32_;
      auVar227 = auVar228._0_32_;
      auVar234 = auVar235._0_32_;
LAB_010ee0f8:
      auVar155 = vandps_avx(local_420,local_400);
      fVar85 = ray->tfar;
      auVar97._4_4_ = fVar85;
      auVar97._0_4_ = fVar85;
      auVar97._8_4_ = fVar85;
      auVar97._12_4_ = fVar85;
      auVar97._16_4_ = fVar85;
      auVar97._20_4_ = fVar85;
      auVar97._24_4_ = fVar85;
      auVar97._28_4_ = fVar85;
      auVar47 = vcmpps_avx(_local_540,auVar97,2);
      auVar48 = auVar155 & auVar47;
      if ((((((((auVar48 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar48 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar48 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar48 >> 0x7f,0) == '\0') &&
            (auVar48 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar48 >> 0xbf,0) == '\0') &&
          (auVar48 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar48[0x1f])
      {
        return bVar84;
      }
      auVar48 = vcmpps_avx(local_3e0,_local_5a0,0);
      auVar110 = vblendvps_avx(auVar110,local_c0,auVar48);
      auVar127 = vblendvps_avx(auVar127,local_120,auVar48);
      auVar139 = vblendvps_avx(auVar139,local_140,auVar48);
      auVar48 = vcmpps_avx(local_3e0,local_380,0);
      auVar49 = vcmpps_avx(local_3e0,_local_520,0);
      auVar48 = vorps_avx(auVar48,auVar49);
      fVar85 = local_3e0._0_4_;
      fVar174 = local_3e0._4_4_;
      fVar92 = local_3e0._8_4_;
      fVar106 = local_3e0._12_4_;
      fVar112 = local_3e0._16_4_;
      fVar114 = local_3e0._20_4_;
      fVar116 = local_3e0._24_4_;
      fVar118 = auVar188._28_4_;
      fVar120 = auVar209._0_4_;
      fVar122 = auVar209._4_4_;
      fVar215 = auVar209._8_4_;
      fVar217 = auVar209._12_4_;
      fVar218 = auVar209._16_4_;
      fVar219 = auVar209._20_4_;
      fVar220 = auVar209._24_4_;
      auVar151._0_4_ = fVar120 * (auVar227._0_4_ + fVar85 * local_3c0) + local_320;
      auVar151._4_4_ = fVar122 * (auVar227._4_4_ + fVar174 * fStack_3bc) + fStack_31c;
      auVar151._8_4_ = fVar215 * (auVar227._8_4_ + fVar92 * fStack_3b8) + fStack_318;
      auVar151._12_4_ = fVar217 * (auVar227._12_4_ + fVar106 * fStack_3b4) + fStack_314;
      auVar151._16_4_ = fVar218 * (auVar227._16_4_ + fVar112 * fStack_3b0) + fStack_310;
      auVar151._20_4_ = fVar219 * (auVar227._20_4_ + fVar114 * fStack_3ac) + fStack_30c;
      auVar151._24_4_ = fVar220 * (auVar227._24_4_ + fVar116 * fStack_3a8) + fStack_308;
      auVar151._28_4_ = auVar227._28_4_ + auVar49._28_4_ + fStack_304;
      auVar156._0_4_ = fVar120 * (auVar188._0_4_ + fVar85 * (float)local_160._0_4_) + local_a0;
      auVar156._4_4_ = fVar122 * (auVar188._4_4_ + fVar174 * (float)local_160._4_4_) + fStack_9c;
      auVar156._8_4_ = fVar215 * (auVar188._8_4_ + fVar92 * fStack_158) + fStack_98;
      auVar156._12_4_ = fVar217 * (auVar188._12_4_ + fVar106 * fStack_154) + fStack_94;
      auVar156._16_4_ = fVar218 * (auVar188._16_4_ + fVar112 * fStack_150) + fStack_90;
      auVar156._20_4_ = fVar219 * (auVar188._20_4_ + fVar114 * fStack_14c) + fStack_8c;
      auVar156._24_4_ = fVar220 * (auVar188._24_4_ + fVar116 * fStack_148) + fStack_88;
      auVar156._28_4_ = fVar118 + fVar164 + fStack_84;
      auVar171._0_4_ = fVar120 * (auVar234._0_4_ + auVar221._0_4_ * fVar85) + local_e0;
      auVar171._4_4_ = fVar122 * (auVar234._4_4_ + auVar221._4_4_ * fVar174) + fStack_dc;
      auVar171._8_4_ = fVar215 * (auVar234._8_4_ + auVar221._8_4_ * fVar92) + fStack_d8;
      auVar171._12_4_ = fVar217 * (auVar234._12_4_ + auVar221._12_4_ * fVar106) + fStack_d4;
      auVar171._16_4_ = fVar218 * (auVar234._16_4_ + auVar221._16_4_ * fVar112) + fStack_d0;
      auVar171._20_4_ = fVar219 * (auVar234._20_4_ + auVar221._20_4_ * fVar114) + fStack_cc;
      auVar171._24_4_ = fVar220 * (auVar234._24_4_ + auVar221._24_4_ * fVar116) + fStack_c8;
      auVar171._28_4_ = auVar234._28_4_ + local_3e0._28_4_ + fStack_c4;
      auVar111._0_4_ = (float)local_3a0._0_4_ * local_340;
      auVar111._4_4_ = (float)local_3a0._4_4_ * fStack_33c;
      auVar111._8_4_ = fStack_398 * fStack_338;
      auVar111._12_4_ = fStack_394 * fStack_334;
      auVar111._16_4_ = fStack_390 * fStack_330;
      auVar111._20_4_ = fStack_38c * fStack_32c;
      auVar111._28_36_ = auVar188._28_36_;
      auVar111._24_4_ = fStack_388 * fStack_328;
      auVar227 = vsubps_avx(auVar151,auVar111._0_32_);
      auVar75._4_4_ = (float)local_3a0._4_4_ * fStack_7c;
      auVar75._0_4_ = (float)local_3a0._0_4_ * local_80;
      auVar75._8_4_ = fStack_398 * fStack_78;
      auVar75._12_4_ = fStack_394 * fStack_74;
      auVar75._16_4_ = fStack_390 * fStack_70;
      auVar75._20_4_ = fStack_38c * fStack_6c;
      auVar75._24_4_ = fStack_388 * fStack_68;
      auVar75._28_4_ = fVar118;
      auVar234 = vsubps_avx(auVar156,auVar75);
      auVar76._4_4_ = (float)local_3a0._4_4_ * fStack_2fc;
      auVar76._0_4_ = (float)local_3a0._0_4_ * local_300;
      auVar76._8_4_ = fStack_398 * fStack_2f8;
      auVar76._12_4_ = fStack_394 * fStack_2f4;
      auVar76._16_4_ = fStack_390 * fStack_2f0;
      auVar76._20_4_ = fStack_38c * fStack_2ec;
      auVar76._24_4_ = fStack_388 * fStack_2e8;
      auVar76._28_4_ = fVar118;
      auVar49 = vsubps_avx(auVar171,auVar76);
      local_1e0 = vblendvps_avx(auVar110,auVar227,auVar48);
      local_1c0 = vblendvps_avx(auVar127,auVar234,auVar48);
      local_1a0 = vblendvps_avx(auVar139,auVar49,auVar48);
      auVar77._4_4_ = (float)local_3a0._4_4_ * fStack_fc;
      auVar77._0_4_ = (float)local_3a0._0_4_ * local_100;
      auVar77._8_4_ = fStack_398 * fStack_f8;
      auVar77._12_4_ = fStack_394 * fStack_f4;
      auVar77._16_4_ = fStack_390 * fStack_f0;
      auVar77._20_4_ = fStack_38c * fStack_ec;
      auVar77._24_4_ = fStack_388 * fStack_e8;
      auVar77._28_4_ = auVar227._28_4_;
      local_240 = vblendvps_avx(_local_4e0,auVar77,auVar48);
      auVar155 = vandps_avx(auVar47,auVar155);
      local_220 = ZEXT832(0) << 0x20;
      _local_200 = _local_540;
      uVar81 = vmovmskps_avx(auVar155);
      uVar83 = CONCAT44((int)(uVar83 >> 0x20),uVar81);
      pSVar80 = context->scene;
      do {
        local_5d0.hit = (RTCHitN *)&local_600;
        local_5d0.valid = &local_60c;
        uVar16 = 0;
        if (uVar83 != 0) {
          for (; (uVar83 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
          }
        }
        pGVar12 = (pSVar80->geometries).items[*(uint *)(local_260 + uVar16 * 4)].ptr;
        if ((pGVar12->mask & ray->mask) != 0) {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (bVar78 = 1, pGVar12->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_010ee410;
          local_600 = *(undefined4 *)(local_1e0 + uVar16 * 4);
          local_5fc = *(undefined4 *)(local_1c0 + uVar16 * 4);
          local_5f8 = *(undefined4 *)(local_1a0 + uVar16 * 4);
          local_5f4 = *(undefined4 *)(local_240 + uVar16 * 4);
          local_5f0 = *(undefined4 *)(local_220 + uVar16 * 4);
          local_5ec = (local_578->primIDs).field_0.i[uVar16];
          local_5e8 = *(uint *)(local_260 + uVar16 * 4);
          local_5e4 = context->user->instID[0];
          local_5e0 = context->user->instPrimID[0];
          local_5a0._0_4_ = ray->tfar;
          ray->tfar = *(float *)(local_200 + uVar16 * 4);
          local_60c = -1;
          local_5d0.geometryUserPtr = pGVar12->userPtr;
          local_5d0.context = context->user;
          local_5d0.N = 1;
          local_5d0.ray = (RTCRayN *)ray;
          if ((pGVar12->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
             ((*pGVar12->occlusionFilterN)(&local_5d0), context = local_608, *local_5d0.valid != 0))
          {
            p_Var15 = context->args->filter;
            if ((p_Var15 == (RTCFilterFunctionN)0x0) ||
               ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                  RTC_RAY_QUERY_FLAG_INCOHERENT && (((pGVar12->field_8).field_0x2 & 0x40) == 0)) ||
                ((*p_Var15)(&local_5d0), *local_5d0.valid != 0)))) {
              bVar78 = 1;
              goto LAB_010ee410;
            }
          }
          local_568->tfar = (float)local_5a0._0_4_;
          context = local_608;
          ray = local_568;
        }
        uVar83 = uVar83 ^ 1L << (uVar16 & 0x3f);
        if (uVar83 == 0) {
          bVar78 = 0;
LAB_010ee410:
          return (bool)(bVar84 | bVar78);
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& line)
      {
        STAT3(shadow.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; 
        vbool<M> cL,cR;
        line.gather(v0,v1,cL,cR,geom,ray.time());
        const vbool<M> valid = line.valid();
        return ConeCurveIntersector1<M>::intersect(valid,ray,context,geom,pre,v0,v1,cL,cR,Occluded1EpilogM<M,filter>(ray,context,line.geomID(),line.primID()));
        return false;
      }